

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.h
# Opt level: O3

void __thiscall BackupRestaurant::~BackupRestaurant(BackupRestaurant *this)

{
  pointer pcVar1;
  
  (this->super_BaseAction)._vptr_BaseAction = (_func_int **)&PTR___cxa_pure_virtual_001108a0;
  pcVar1 = (this->super_BaseAction).errorMsg._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_BaseAction).errorMsg.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual  ~BackupRestaurant() = default;